

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_split_list(t_list_split *x,t_symbol *s,int argc,t_atom *argv)

{
  int local_2c;
  int n;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_list_split *x_local;
  
  local_2c = (int)x->x_f;
  if (local_2c < 0) {
    local_2c = 0;
  }
  if (argc < local_2c) {
    outlet_list(x->x_out3,&s_list,argc,argv);
  }
  else {
    outlet_list(x->x_out2,&s_list,argc - local_2c,argv + local_2c);
    outlet_list(x->x_out1,&s_list,local_2c,argv);
  }
  return;
}

Assistant:

static void list_split_list(t_list_split *x, t_symbol *s,
    int argc, t_atom *argv)
{
    int n = x->x_f;
    if (n < 0)
        n = 0;
    if (argc >= n)
    {
        outlet_list(x->x_out2, &s_list, argc-n, argv+n);
        outlet_list(x->x_out1, &s_list, n, argv);
    }
    else outlet_list(x->x_out3, &s_list, argc, argv);
}